

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBlendTests.cpp
# Opt level: O1

void __thiscall deqp::gles3::Functional::BlendCase::deinit(BlendCase *this)

{
  QuadRenderer *this_00;
  TextureLevel *this_01;
  GLenum GVar1;
  
  this_00 = this->m_renderer;
  if (this_00 != (QuadRenderer *)0x0) {
    deqp::gls::FragmentOpUtil::QuadRenderer::~QuadRenderer(this_00);
    operator_delete(this_00,0x20);
  }
  if (this->m_referenceRenderer != (ReferenceQuadRenderer *)0x0) {
    operator_delete(this->m_referenceRenderer,0x11108);
  }
  this_01 = this->m_refColorBuffer;
  if (this_01 != (TextureLevel *)0x0) {
    tcu::TextureLevel::~TextureLevel(this_01);
    operator_delete(this_01,0x28);
  }
  this->m_renderer = (QuadRenderer *)0x0;
  this->m_referenceRenderer = (ReferenceQuadRenderer *)0x0;
  this->m_refColorBuffer = (TextureLevel *)0x0;
  glwBindRenderbuffer(0x8d41,0);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glBindRenderbuffer(GL_RENDERBUFFER, 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                  ,0xf1);
  glwBindFramebuffer(0x8d40,0);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glBindFramebuffer(GL_FRAMEBUFFER, 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                  ,0xf2);
  if (this->m_colorRbo != 0) {
    glwDeleteRenderbuffers(1,&this->m_colorRbo);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glDeleteRenderbuffers(1, &m_colorRbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xf6);
    this->m_colorRbo = 0;
  }
  if (this->m_fbo != 0) {
    glwDeleteFramebuffers(1,&this->m_fbo);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glDeleteFramebuffers(1, &m_fbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xfb);
    this->m_fbo = 0;
  }
  return;
}

Assistant:

void BlendCase::deinit (void)
{
	delete m_renderer;
	delete m_referenceRenderer;
	delete m_refColorBuffer;

	m_renderer			= DE_NULL;
	m_referenceRenderer	= DE_NULL;
	m_refColorBuffer	= DE_NULL;

	GLU_CHECK_CALL(glBindRenderbuffer(GL_RENDERBUFFER, 0));
	GLU_CHECK_CALL(glBindFramebuffer(GL_FRAMEBUFFER, 0));

	if (m_colorRbo != 0)
	{
		GLU_CHECK_CALL(glDeleteRenderbuffers(1, &m_colorRbo));
		m_colorRbo = 0;
	}
	if (m_fbo != 0)
	{
		GLU_CHECK_CALL(glDeleteFramebuffers(1, &m_fbo));
		m_fbo = 0;
	}
}